

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

evdns_getaddrinfo_request *
evutil_getaddrinfo_async_
          (evdns_base *dns_base,char *nodename,char *servname,addrinfo *hints_in,
          _func_void_int_addrinfo_ptr_void_ptr *cb,void *arg)

{
  int iVar1;
  evdns_getaddrinfo_request *peVar2;
  addrinfo *ai;
  addrinfo *local_20;
  
  if (evdns_getaddrinfo_impl != (evdns_getaddrinfo_fn)0x0 && dns_base != (evdns_base *)0x0) {
    peVar2 = (*evdns_getaddrinfo_impl)(dns_base,nodename,servname,hints_in,cb,arg);
    return peVar2;
  }
  local_20 = (addrinfo *)0x0;
  iVar1 = evutil_getaddrinfo(nodename,servname,hints_in,&local_20);
  (*cb)(iVar1,local_20,arg);
  return (evdns_getaddrinfo_request *)0x0;
}

Assistant:

struct evdns_getaddrinfo_request *evutil_getaddrinfo_async_(
    struct evdns_base *dns_base,
    const char *nodename, const char *servname,
    const struct evutil_addrinfo *hints_in,
    void (*cb)(int, struct evutil_addrinfo *, void *), void *arg)
{
	if (dns_base && evdns_getaddrinfo_impl) {
		return evdns_getaddrinfo_impl(
			dns_base, nodename, servname, hints_in, cb, arg);
	} else {
		struct evutil_addrinfo *ai=NULL;
		int err;
		err = evutil_getaddrinfo(nodename, servname, hints_in, &ai);
		cb(err, ai, arg);
		return NULL;
	}
}